

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

PropertyRecord *
Js::TMapKey_ConvertKey_TTD<Js::PropertyRecord_const*>
          (ThreadContext *threadContext,JavascriptString *key)

{
  JavascriptString *this;
  bool bVar1;
  charcount_t propertyNameLength;
  char16 *propertyName;
  PropertyString *local_38;
  PropertyString *propertyString;
  PropertyRecord *propertyRecord;
  JavascriptString *key_local;
  ThreadContext *threadContext_local;
  
  propertyRecord = (PropertyRecord *)key;
  key_local = (JavascriptString *)threadContext;
  threadContext_local = (ThreadContext *)key;
  bVar1 = VarIs<Js::PropertyString,Js::JavascriptString>(key);
  if (bVar1) {
    local_38 = UnsafeVarTo<Js::PropertyString,Js::JavascriptString>
                         ((JavascriptString *)threadContext_local);
  }
  else {
    local_38 = (PropertyString *)0x0;
  }
  this = key_local;
  if (local_38 == (PropertyString *)0x0) {
    propertyName = JavascriptString::GetString((JavascriptString *)propertyRecord);
    propertyNameLength = JavascriptString::GetLength((JavascriptString *)propertyRecord);
    ThreadContext::GetOrAddPropertyId
              ((ThreadContext *)this,propertyName,propertyNameLength,
               (PropertyRecord **)&propertyString);
  }
  else {
    (*(local_38->super_JavascriptString).super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x61])(local_38,&propertyString,0);
  }
  return (PropertyRecord *)propertyString;
}

Assistant:

const PropertyRecord* TMapKey_ConvertKey_TTD(ThreadContext* threadContext, JavascriptString* key)
    {
        PropertyRecord const * propertyRecord;
        PropertyString * propertyString = JavascriptOperators::TryFromVar<PropertyString>(key);
        if (propertyString != nullptr)
        {
            propertyString->GetPropertyRecord(&propertyRecord);
        }
        else
        {
            threadContext->GetOrAddPropertyId(key->GetString(), key->GetLength(), &propertyRecord);
        }
        return propertyRecord;
    }